

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* lest::split_option(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *__return_storage_ptr__,text *arg)

{
  long lVar1;
  undefined1 *local_160;
  undefined8 local_158;
  undefined1 local_150 [16];
  string local_140 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  
  lVar1 = std::__cxx11::string::rfind((char)arg,0x3d);
  if (lVar1 == -1) {
    std::__cxx11::string::string((string *)&local_c0,(string *)arg);
    local_160 = local_150;
    local_158 = 0;
    local_150[0] = 0;
    std::__cxx11::string::string((string *)&local_e0,(string *)&local_160);
    std::make_pair<std::__cxx11::string,std::__cxx11::string>(&local_a0,&local_c0,&local_e0);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair(&local_60,&local_a0);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_160,(ulong)arg);
    std::__cxx11::string::string((string *)&local_100,(string *)&local_160);
    std::__cxx11::string::substr((ulong)local_140,(ulong)arg);
    std::__cxx11::string::string((string *)&local_120,local_140);
    std::make_pair<std::__cxx11::string,std::__cxx11::string>(&local_a0,&local_100,&local_120);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair(&local_60,&local_a0);
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair(__return_storage_ptr__,&local_60);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_60);
  if (lVar1 == -1) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_a0);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  else {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_a0);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<text, text>
split_option( text arg )
{
    text::size_type pos = arg.rfind( '=' );

    return pos == text::npos
                ? std::make_pair( arg, text() )
                : std::make_pair( arg.substr( 0, pos ), arg.substr( pos + 1 ) );
}